

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_AddingEqualPoints_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_AddingEqualPoints_Test> *this
          )

{
  Test *this_00;
  
  WithParamInterface<int>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x20);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_006d7960;
  this_00[1]._vptr_Test = (_func_int **)&PTR__ECCurveTest_AddingEqualPoints_Test_006d79a0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }